

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlNodeSetPtr xmlXPathNodeSetMerge(xmlNodeSetPtr val1,xmlNodeSetPtr val2)

{
  xmlNodePtr pxVar1;
  int iVar2;
  xmlNodePtr ns;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (val1 == (xmlNodeSetPtr)0x0) {
    val1 = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
    if (val1 == (xmlNodeSetPtr)0x0) {
      return (xmlNodeSetPtr)0x0;
    }
    val1->nodeNr = 0;
    val1->nodeMax = 0;
    val1->nodeTab = (xmlNodePtr *)0x0;
  }
  if (val2 != (xmlNodeSetPtr)0x0) {
    uVar5 = 0;
    uVar4 = (ulong)(uint)val1->nodeNr;
    if (val1->nodeNr < 1) {
      uVar4 = uVar5;
    }
    for (; (long)uVar5 < (long)val2->nodeNr; uVar5 = uVar5 + 1) {
      ns = val2->nodeTab[uVar5];
      for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        pxVar1 = val1->nodeTab[uVar3];
        if ((pxVar1 == ns) ||
           ((((pxVar1->type == XML_NAMESPACE_DECL && (ns->type == XML_NAMESPACE_DECL)) &&
             ((_xmlNs *)pxVar1->_private == (_xmlNs *)ns->_private)) &&
            (iVar2 = xmlStrEqual((xmlChar *)pxVar1->children,(xmlChar *)ns->children), iVar2 != 0)))
           ) goto LAB_001af96d;
      }
      if (((val1->nodeMax <= val1->nodeNr) && (iVar2 = xmlXPathNodeSetGrow(val1), iVar2 < 0)) ||
         ((ns->type == XML_NAMESPACE_DECL &&
          (ns = xmlXPathNodeSetDupNs((xmlNodePtr)ns->_private,(xmlNsPtr)ns), ns == (xmlNodePtr)0x0))
         )) {
        xmlXPathFreeNodeSet(val1);
        return (xmlNodeSetPtr)0x0;
      }
      iVar2 = val1->nodeNr;
      val1->nodeNr = iVar2 + 1;
      val1->nodeTab[iVar2] = ns;
LAB_001af96d:
    }
  }
  return val1;
}

Assistant:

xmlNodeSetPtr
xmlXPathNodeSetMerge(xmlNodeSetPtr val1, xmlNodeSetPtr val2) {
    int i, j, initNr, skip;
    xmlNodePtr n1, n2;

    if (val1 == NULL) {
	val1 = xmlXPathNodeSetCreate(NULL);
        if (val1 == NULL)
            return (NULL);
    }
    if (val2 == NULL)
        return(val1);

    /* @@ with_ns to check whether namespace nodes should be looked at @@ */
    initNr = val1->nodeNr;

    for (i = 0;i < val2->nodeNr;i++) {
	n2 = val2->nodeTab[i];
	/*
	 * check against duplicates
	 */
	skip = 0;
	for (j = 0; j < initNr; j++) {
	    n1 = val1->nodeTab[j];
	    if (n1 == n2) {
		skip = 1;
		break;
	    } else if ((n1->type == XML_NAMESPACE_DECL) &&
		       (n2->type == XML_NAMESPACE_DECL)) {
		if ((((xmlNsPtr) n1)->next == ((xmlNsPtr) n2)->next) &&
		    (xmlStrEqual(((xmlNsPtr) n1)->prefix,
			((xmlNsPtr) n2)->prefix)))
		{
		    skip = 1;
		    break;
		}
	    }
	}
	if (skip)
	    continue;

	/*
	 * grow the nodeTab if needed
	 */
        if (val1->nodeNr >= val1->nodeMax) {
            if (xmlXPathNodeSetGrow(val1) < 0)
                goto error;
        }
	if (n2->type == XML_NAMESPACE_DECL) {
	    xmlNsPtr ns = (xmlNsPtr) n2;
            xmlNodePtr nsNode = xmlXPathNodeSetDupNs((xmlNodePtr) ns->next, ns);

            if (nsNode == NULL)
                goto error;
	    val1->nodeTab[val1->nodeNr++] = nsNode;
	} else
	    val1->nodeTab[val1->nodeNr++] = n2;
    }

    return(val1);

error:
    xmlXPathFreeNodeSet(val1);
    return(NULL);
}